

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef lj_opt_fwd_hrefk(jit_State *J)

{
  ushort uVar1;
  uint ta;
  AliasRet AVar2;
  TRef TVar3;
  IRIns *pIVar4;
  IRIns *newref;
  IRRef ref;
  IRRef tab;
  jit_State *J_local;
  
  ta = (uint)(J->fold).left[0].field_0.op1;
  uVar1 = J->chain[0x3b];
  do {
    newref._0_4_ = (uint)uVar1;
    if ((uint)newref <= ta) {
      if (*(char *)((long)(J->cur).ir + (ulong)ta * 8 + 5) == 'R') {
        (J->fold).ins.field_1.t.irt = (J->fold).ins.field_1.t.irt & 0x7f;
      }
LAB_001a58cc:
      TVar3 = lj_opt_cse(J);
      return TVar3;
    }
    pIVar4 = (J->cur).ir + (uint)newref;
    if (ta == (pIVar4->field_0).op1) {
      if ((J->fold).right[0].field_0.op1 == (pIVar4->field_0).op2) {
        return (uint)newref;
      }
      goto LAB_001a58cc;
    }
    AVar2 = aa_table(J,ta,(uint)(pIVar4->field_0).op1);
    if (AVar2 != ALIAS_NO) goto LAB_001a58cc;
    uVar1 = (pIVar4->field_0).prev;
  } while( true );
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_hrefk(jit_State *J)
{
  IRRef tab = fleft->op1;
  IRRef ref = J->chain[IR_NEWREF];
  while (ref > tab) {
    IRIns *newref = IR(ref);
    if (tab == newref->op1) {
      if (fright->op1 == newref->op2)
	return ref;  /* Forward from NEWREF. */
      else
	goto docse;
    } else if (aa_table(J, tab, newref->op1) != ALIAS_NO) {
      goto docse;
    }
    ref = newref->prev;
  }
  /* No conflicting NEWREF: key location unchanged for HREFK of TDUP. */
  if (IR(tab)->o == IR_TDUP)
    fins->t.irt &= ~IRT_GUARD;  /* Drop HREFK guard. */
docse:
  return CSEFOLD;
}